

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pw91_lda_rpa.hpp
# Opt level: O3

void ExchCXX::kernel_traits<ExchCXX::BuiltinPW91_LDA_RPA>::eval_exc_vxc_polar_impl
               (double rho_a,double rho_b,double *eps,double *vrho_a,double *vrho_b)

{
  double __x;
  double dVar1;
  double dVar2;
  double __x_00;
  double dVar3;
  double dVar4;
  double dVar5;
  ulong uVar6;
  ulong uVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  undefined1 auVar19 [16];
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  undefined1 auVar24 [16];
  double dVar25;
  double dVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double __x_01;
  double dVar36;
  double dVar37;
  undefined8 local_218;
  
  __x = rho_a + rho_b;
  dVar8 = cbrt(__x);
  dVar8 = 1.0 / dVar8;
  dVar37 = dVar8 * 1.720508027656199;
  dVar23 = dVar8 * 2.4814019635975995;
  dVar11 = SQRT(dVar23);
  local_218 = dVar11;
  if (dVar23 < 0.0) {
    local_218 = sqrt(dVar23);
  }
  if (dVar23 < 0.0) {
    dVar11 = sqrt(dVar23);
  }
  dVar11 = dVar11 * dVar11 * dVar11;
  dVar17 = dVar23 * 0.25;
  dVar1 = pow(dVar17,1.75);
  dVar12 = dVar11 * 0.02955875 + dVar37 * 2.3772599667377015 * 0.25 + local_218 * 5.1486 * 0.5 +
           dVar1 * 0.20614;
  dVar9 = (32.16364864430221 / dVar12) * 0.5 + 1.0;
  dVar36 = log(dVar9);
  dVar10 = rho_a - rho_b;
  dVar13 = __x * __x;
  dVar20 = 1.0 / __x;
  dVar18 = dVar10 * dVar20 + 1.0;
  dVar22 = cbrt(1e-15);
  dVar30 = cbrt(dVar18);
  dVar26 = 1.0 - dVar10 * dVar20;
  dVar32 = cbrt(dVar26);
  dVar2 = pow(dVar17,1.75);
  dVar14 = dVar11 * 0.018975 + dVar37 * 1.8868951128331823 * 0.25 + local_218 * 6.4869 * 0.5 +
           dVar2 * 0.082349;
  __x_00 = (64.3293663557414 / dVar14) * 0.5 + 1.0;
  dVar3 = log(__x_00);
  uVar6 = -(ulong)(dVar18 <= 1e-15);
  dVar15 = (1.0 / dVar13) * dVar10;
  dVar4 = dVar20 - dVar15;
  dVar16 = 0.0;
  if (1e-15 < dVar18) {
    dVar16 = dVar4 * dVar30 * 1.3333333333333333;
  }
  dVar31 = dVar37 * 0.11895241781024411 * 0.25 + 1.0;
  uVar7 = -(ulong)(dVar26 <= 1e-15);
  dVar25 = dVar37 * 0.051018136300054265 * 0.25 + 1.0;
  dVar34 = dVar17 * dVar17 * 0.12279;
  dVar17 = dVar37 * 0.04157861286239228 * 0.25 + 1.0;
  dVar21 = dVar11 * 0.0599875 + dVar37 * 5.225414418180771 * 0.25 + local_218 * 10.357 * 0.5 +
           dVar34;
  dVar8 = dVar8 / __x;
  local_218 = 1.0 / local_218;
  dVar11 = dVar8 * 1.720508027656199;
  auVar28._0_8_ = local_218 * 5.1486 * -1.4422495703074083 * dVar11;
  auVar28._8_8_ = dVar11 * 2.3772599667377015;
  auVar28 = divpd(auVar28,_DAT_010257c0);
  dVar37 = 0.0;
  if (1e-15 < dVar26) {
    dVar37 = -dVar4 * dVar32 * 1.3333333333333333;
  }
  auVar29._0_8_ = local_218 * 6.4869 * -1.4422495703074083 * dVar11;
  auVar29._8_8_ = dVar11 * 1.8868951128331823;
  auVar29 = divpd(auVar29,_DAT_010257c0);
  auVar19._0_8_ = local_218 * 10.357 * -1.4422495703074083 * dVar11;
  auVar19._8_8_ = dVar11 * 5.225414418180771;
  auVar19 = divpd(auVar19,_DAT_010257c0);
  dVar4 = dVar10 * dVar10;
  dVar33 = (dVar8 * 0.006363040213968214 * dVar36) / 6.0;
  __x_01 = (59.217149286433354 / dVar21) * 0.5 + 1.0;
  dVar5 = log(__x_01);
  if (dVar23 < 0.0) {
    dVar23 = sqrt(dVar23);
  }
  else {
    dVar23 = SQRT(dVar23);
  }
  dVar35 = (1.0 / (dVar12 * dVar12)) * dVar31 *
           (1.0 / dVar9) *
           ((dVar23 * 0.23647 * 1.4422495703074083 * -0.0625 * dVar11 +
            (auVar28._0_8_ - auVar28._8_8_)) - (dVar1 * 0.20614 * 1.75 * dVar20) / 3.0);
  auVar24._8_8_ = dVar21 * dVar21;
  auVar24._0_8_ = __x_01;
  auVar24 = divpd(_DAT_01025040,auVar24);
  dVar1 = (dVar23 * 0.4799 * 1.4422495703074083 * -0.0625 * dVar11 + (auVar19._0_8_ - auVar19._8_8_)
          ) - ((dVar34 + dVar34) * dVar20) / 3.0;
  dVar16 = (dVar37 + dVar16) * 1.9236610509315362;
  dVar21 = ((double)(~uVar6 & (ulong)(dVar18 * dVar30) | uVar6 & (ulong)(dVar22 * 1e-15)) +
            (double)((ulong)(dVar22 * 1e-15) & uVar7 | ~uVar7 & (ulong)(dVar26 * dVar32)) + -2.0) *
           1.9236610509315362;
  dVar36 = dVar36 * dVar31 * 0.031091;
  dVar9 = dVar36 * 2.0 + dVar25 * -0.03109 * dVar3 + dVar17 * -0.033774 * dVar5 * 0.5848223397455204
  ;
  auVar27._0_8_ = dVar13 * dVar13;
  auVar27._8_8_ = __x * auVar27._0_8_;
  auVar28 = divpd(_DAT_01025040,auVar27);
  dVar22 = dVar21 * dVar9;
  dVar13 = (dVar5 * dVar11 * 0.5848223397455204 * dVar21 * 0.0007021380354072183) / 6.0;
  dVar26 = dVar1 * auVar24._8_8_ * auVar24._0_8_ * 0.5848223397455204 * dVar17 * dVar21;
  dVar15 = -dVar20 - dVar15;
  dVar18 = dVar5 * dVar17 * 0.5848223397455204;
  dVar32 = ((double)(~uVar7 & (ulong)(dVar32 * 1.3333333333333333 * -dVar15)) +
           (double)(~uVar6 & (ulong)(dVar30 * 1.3333333333333333 * dVar15))) * 1.9236610509315362;
  dVar30 = dVar16 * 0.016887 * dVar18;
  dVar12 = dVar32 * 0.016887 * dVar18;
  dVar37 = auVar28._0_8_ * dVar4 * dVar4;
  dVar8 = dVar37 * dVar21 * (auVar24._8_8_ * dVar17 * dVar1 * auVar24._0_8_ * 0.5848223397455204 +
                            (dVar8 * 2.519842099789747 * 0.00047940866078143105 *
                            dVar5 * 0.5848223397455204) / 6.0 +
                            (((dVar25 * (1.0 / (dVar14 * dVar14)) *
                               (1.0 / __x_00) *
                               ((dVar23 * 0.1518 * 1.4422495703074083 * -0.0625 * dVar11 +
                                (auVar29._0_8_ - auVar29._8_8_)) -
                               (dVar2 * 0.082349 * 1.75 * dVar20) / 3.0) +
                              (dVar8 * 0.0013644952225223869 * dVar3) / 6.0) - dVar33) - dVar35));
  dVar11 = dVar22 * dVar4 * dVar10 * auVar28._0_8_ * 4.0;
  dVar17 = dVar22 * dVar4 * dVar4 * auVar28._8_8_ * 4.0;
  dVar23 = (dVar22 * dVar37 - dVar36 * 2.0) + dVar21 * 2.0 * 0.016887 * dVar18;
  dVar35 = dVar35 + dVar33;
  *eps = dVar23;
  *vrho_a = (((((dVar11 + dVar35) - dVar17) + dVar37 * dVar16 * dVar9 + dVar8 + dVar30 + dVar30) -
             dVar13) - dVar26) * __x + dVar23;
  *vrho_b = (((((dVar35 - dVar11) - dVar17) + dVar9 * dVar32 * dVar37 + dVar8 + dVar12 + dVar12) -
             dVar13) - dVar26) * __x + dVar23;
  return;
}

Assistant:

BUILTIN_KERNEL_EVAL_RETURN
    eval_exc_vxc_polar_impl( double rho_a, double rho_b, double& eps, double& vrho_a, double& vrho_b ) {

    (void)(eps);
    constexpr double t3 = constants::m_cbrt_3;
    constexpr double t6 = constants::m_cbrt_one_ov_pi;
    constexpr double t7 = constants::m_cbrt_4;
    constexpr double t70 = constants::m_cbrt_2;
    constexpr double t1 = a_0;
    constexpr double t2 = alpha1_0;
    constexpr double t4 = t2 * t3;
    constexpr double t8 = t7 * t7;
    constexpr double t9 = t6 * t8;
    constexpr double t18 = 0.1e1 / t1;
    constexpr double t19 = beta1_0;
    constexpr double t20 = t3 * t6;
    constexpr double t27 = beta2_0 * t3;
    constexpr double t30 = beta3_0;
    constexpr double t37 = pp_0 + 0.1e1;
    constexpr double t75 = a_1;
    constexpr double t76 = alpha1_1;
    constexpr double t77 = t76 * t3;
    constexpr double t82 = 0.1e1 / t75;
    constexpr double t83 = beta1_1;
    constexpr double t87 = beta2_1 * t3;
    constexpr double t90 = beta3_1;
    constexpr double t95 = pp_1 + 0.1e1;
    constexpr double t105 = a_2;
    constexpr double t106 = alpha1_2;
    constexpr double t107 = t106 * t3;
    constexpr double t112 = 0.1e1 / t105;
    constexpr double t113 = beta1_2;
    constexpr double t117 = beta2_2 * t3;
    constexpr double t120 = beta3_2;
    constexpr double t125 = pp_2 + 0.1e1;
    constexpr double t134 = 0.1e1 / fz20;
    constexpr double t147 = t1 * t2 * t3;
    constexpr double t201 = t75 * t76 * t3;
    constexpr double t226 = t105 * t106;
    constexpr double t227 = t226 * t20;
    constexpr double t259 = t226 * t3;


    const double t10 = rho_a + rho_b;
    const double t11 = safe_math::cbrt( t10 );
    const double t12 = 0.1e1 / t11;
    const double t13 = t9 * t12;
    const double t16 = 0.1e1 + t4 * t13 / 0.4e1;
    const double t22 = t20 * t8 * t12;
    const double t23 = safe_math::sqrt( t22 );
    const double t31 = pow_3_2( t22 );
    const double t35 = t22 / 0.4e1;
    const double t38 = safe_math::pow( t35, t37 );
    const double t39 = beta4_0 * t38;
    const double t40 = t19 * t23 / 0.2e1 + t27 * t13 / 0.4e1 + 0.125e0 * t30 * t31 + t39;
    const double t44 = 0.1e1 + t18 / t40 / 0.2e1;
    const double t45 = safe_math::log( t44 );
    const double t46 = t1 * t16 * t45;
    const double t47 = 0.2e1 * t46;
    const double t48 = rho_a - rho_b;
    const double t49 = t48 * t48;
    const double t50 = t49 * t49;
    const double t51 = t10 * t10;
    const double t52 = t51 * t51;
    const double t53 = 0.1e1 / t52;
    const double t54 = t50 * t53;
    const double t55 = 0.1e1 / t10;
    const double t56 = t48 * t55;
    const double t57 = 0.1e1 + t56;
    const double t58 = t57 <= zeta_tol;
    const double t59 = safe_math::cbrt( zeta_tol );
    const double t60 = t59 * zeta_tol;
    const double t61 = safe_math::cbrt( t57 );
    const double t63 = piecewise_functor_3( t58, t60, t61 * t57 );
    const double t64 = 0.1e1 - t56;
    const double t65 = t64 <= zeta_tol;
    const double t66 = safe_math::cbrt( t64 );
    const double t68 = piecewise_functor_3( t65, t60, t66 * t64 );
    const double t69 = t63 + t68 - 0.2e1;
    const double t73 = 0.1e1 / ( 0.2e1 * t70 - 0.2e1 );
    const double t74 = t69 * t73;
    const double t80 = 0.1e1 + t77 * t13 / 0.4e1;
    const double t96 = safe_math::pow( t35, t95 );
    const double t97 = beta4_1 * t96;
    const double t98 = t83 * t23 / 0.2e1 + t87 * t13 / 0.4e1 + 0.125e0 * t90 * t31 + t97;
    const double t102 = 0.1e1 + t82 / t98 / 0.2e1;
    const double t103 = safe_math::log( t102 );
    const double t110 = 0.1e1 + t107 * t13 / 0.4e1;
    const double t126 = safe_math::pow( t35, t125 );
    const double t127 = beta4_2 * t126;
    const double t128 = t113 * t23 / 0.2e1 + t117 * t13 / 0.4e1 + 0.125e0 * t120 * t31 + t127;
    const double t132 = 0.1e1 + t112 / t128 / 0.2e1;
    const double t133 = safe_math::log( t132 );
    const double t135 = t133 * t134;
    const double t138 = -0.2e1 * t75 * t80 * t103 - 0.2e1 * t105 * t110 * t135 + 0.2e1 * t46;
    const double t139 = t74 * t138;
    const double t140 = t54 * t139;
    const double t143 = t110 * t133 * t134;
    const double t145 = 0.2e1 * t74 * t105 * t143;
    const double t149 = 0.1e1 / t11 / t10;
    const double t152 = t147 * t9 * t149 * t45;
    const double t153 = t152 / 0.6e1;
    const double t154 = t40 * t40;
    const double t155 = 0.1e1 / t154;
    const double t156 = t16 * t155;
    const double t157 = 0.1e1 / t23;
    const double t159 = t19 * t157 * t3;
    const double t160 = t9 * t149;
    const double t165 = safe_math::sqrt( t22 );
    const double t167 = t30 * t165 * t3;
    const double t173 = -t159 * t160 / 0.12e2 - t27 * t160 / 0.12e2 - 0.625e-1 * t167 * t160 - t39 * t37 * t55 / 0.3e1;
    const double t174 = 0.1e1 / t44;
    const double t175 = t173 * t174;
    const double t176 = t156 * t175;
    const double t177 = t49 * t48;
    const double t178 = t177 * t53;
    const double t179 = t178 * t139;
    const double t180 = 0.4e1 * t179;
    const double t181 = t52 * t10;
    const double t182 = 0.1e1 / t181;
    const double t183 = t50 * t182;
    const double t184 = t183 * t139;
    const double t185 = 0.4e1 * t184;
    const double t186 = 0.1e1 / t51;
    const double t187 = t48 * t186;
    const double t188 = t55 - t187;
    const double t191 = piecewise_functor_3( t58, 0.0, 0.4e1 / 0.3e1 * t61 * t188 );
    const double t192 = -t188;
    const double t195 = piecewise_functor_3( t65, 0.0, 0.4e1 / 0.3e1 * t66 * t192 );
    const double t197 = ( t191 + t195 ) * t73;
    const double t198 = t197 * t138;
    const double t199 = t54 * t198;
    const double t206 = t98 * t98;
    const double t207 = 0.1e1 / t206;
    const double t208 = t80 * t207;
    const double t210 = t83 * t157 * t3;
    const double t216 = t90 * t165 * t3;
    const double t222 = -t210 * t160 / 0.12e2 - t87 * t160 / 0.12e2 - 0.625e-1 * t216 * t160 - t97 * t95 * t55 / 0.3e1;
    const double t223 = 0.1e1 / t102;
    const double t224 = t222 * t223;
    const double t228 = t8 * t149;
    const double t232 = t128 * t128;
    const double t233 = 0.1e1 / t232;
    const double t234 = t110 * t233;
    const double t236 = t113 * t157 * t3;
    const double t242 = t120 * t165 * t3;
    const double t248 = -t236 * t160 / 0.12e2 - t117 * t160 / 0.12e2 - 0.625e-1 * t242 * t160 - t127 * t125 * t55 / 0.3e1;
    const double t249 = 0.1e1 / t132;
    const double t251 = t248 * t249 * t134;
    const double t253 = t201 * t9 * t149 * t103 / 0.6e1 + t208 * t224 - t153 - t176 + t227 * t228 * t135 / 0.6e1 + t234 * t251;
    const double t254 = t74 * t253;
    const double t255 = t54 * t254;
    const double t257 = t197 * t105 * t143;
    const double t258 = 0.2e1 * t257;
    const double t260 = t74 * t259;
    const double t263 = t9 * t149 * t133 * t134;
    const double t264 = t260 * t263;
    const double t265 = t264 / 0.6e1;
    const double t266 = t74 * t110;
    const double t268 = t249 * t134;
    const double t269 = t233 * t248 * t268;
    const double t270 = t266 * t269;
    const double t273 = -t55 - t187;
    const double t276 = piecewise_functor_3( t58, 0.0, 0.4e1 / 0.3e1 * t61 * t273 );
    const double t277 = -t273;
    const double t280 = piecewise_functor_3( t65, 0.0, 0.4e1 / 0.3e1 * t66 * t277 );
    const double t282 = ( t276 + t280 ) * t73;
    const double t283 = t282 * t138;
    const double t284 = t54 * t283;
    const double t286 = t282 * t105 * t143;
    const double t287 = 0.2e1 * t286;


    eps = -t47 + t140 + t145;
    vrho_a = -t47 + t140 + t145 + t10 * ( t153 + t176 + t180 - t185 + t199 + t255 + t258 - t265 - t270 );
    vrho_b = -t47 + t140 + t145 + t10 * ( t153 + t176 - t180 - t185 + t284 + t255 + t287 - t265 - t270 );

  }